

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

bool __thiscall
andres::View<unsigned_char,true,std::allocator<unsigned_long>>::
overlaps<unsigned_char,false,std::allocator<unsigned_long>>
          (View<unsigned_char,true,std::allocator<unsigned_long>> *this,
          View<unsigned_char,_false,_std::allocator<unsigned_long>_> *v)

{
  reference puVar1;
  reference puVar2;
  size_t sVar3;
  reference puVar4;
  reference puVar5;
  void *maxPointerV;
  void *maxPointer;
  void *vDataPointer_;
  void *dataPointer_;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> *v_local;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> *this_local;
  
  View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)this);
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  if ((*(long *)this == 0) || (v->data_ == (pointer)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    puVar1 = *(reference *)this;
    puVar2 = v->data_;
    sVar3 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::size
                      ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)this);
    puVar4 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)this,sVar3 - 1)
    ;
    sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::size(v);
    puVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()(v,sVar3 - 1);
    if (((puVar2 < puVar1) || (puVar4 < puVar2)) && ((puVar1 < puVar2 || (puVar5 < puVar1)))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool View<T, isConst, A>::overlaps
(
    const View<TLocal, isConstLocal, ALocal>& v
) const
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        v.testInvariant();
    }
    if(data_ == 0 || v.data_ == 0) {
        return false;
    }
    else {
        const void* dataPointer_ = data_;
        const void* vDataPointer_ = v.data_;
        const void* maxPointer = & (*this)(this->size()-1);
        const void* maxPointerV = & v(v.size()-1);
        if(    (dataPointer_   <= vDataPointer_ && vDataPointer_ <= maxPointer)
            || (vDataPointer_ <= dataPointer_   && dataPointer_   <= maxPointerV) )
        {
            return true;
        }
    }
    return false;
}